

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_ring_buffer.cc
# Opt level: O2

void __thiscall
webrtc::AudioRingBuffer::MoveReadPositionBackward(AudioRingBuffer *this,size_t frames)

{
  pointer ppRVar1;
  int iVar2;
  string *result;
  pointer ppRVar3;
  size_t moved;
  size_t frames_local;
  FatalMessage local_1a0;
  
  ppRVar3 = (this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppRVar1 = (this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  frames_local = frames;
  while( true ) {
    if (ppRVar3 == ppRVar1) {
      return;
    }
    iVar2 = WebRtc_MoveReadPtr(*ppRVar3,-(int)frames_local);
    moved = (size_t)-iVar2;
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>(&moved,&frames_local,"moved == frames");
    if (result != (string *)0x0) break;
    ppRVar3 = ppRVar3 + 1;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
             ,0x47,result);
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

void AudioRingBuffer::MoveReadPositionBackward(size_t frames) {
  for (auto buf : buffers_) {
    const size_t moved = static_cast<size_t>(
        -WebRtc_MoveReadPtr(buf, -static_cast<int>(frames)));
    RTC_CHECK_EQ(moved, frames);
  }
}